

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_clear(nk_context *ctx)

{
  byte *pbVar1;
  nk_size *pnVar2;
  nk_size nVar3;
  nk_window *pnVar4;
  nk_page_element *pnVar5;
  nk_table *pnVar6;
  nk_page_element *elem;
  nk_size nVar7;
  nk_page_element *__s;
  nk_command_buffer *__s_00;
  nk_window *win;
  nk_page_data *pd;
  ulong uVar8;
  ulong uVar9;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3a81,"void nk_clear(struct nk_context *)");
  }
  if (ctx->use_pool == 0) {
    nVar3 = (ctx->memory).marker[0].offset;
    pnVar2 = &(ctx->memory).needed;
    *pnVar2 = *pnVar2 + (nVar3 - (ctx->memory).allocated);
    nVar7 = 0;
    if ((ctx->memory).marker[0].active != 0) {
      nVar7 = nVar3;
    }
    (ctx->memory).allocated = nVar7;
    (ctx->memory).marker[0].active = 0;
  }
  else {
    (ctx->memory).allocated = 0;
    (ctx->memory).size = (ctx->memory).memory.size;
    (ctx->memory).needed = 0;
    (ctx->memory).calls = 0;
  }
  ctx->build = 0;
  (ctx->memory).calls = 0;
  ctx->last_widget_state = 0;
  (ctx->style).cursor_active = (ctx->style).cursors[0];
  __s_00 = &ctx->overlay;
  uVar8 = (ulong)__s_00 & 3;
  if (uVar8 == 0) {
    uVar9 = 0x40;
  }
  else {
    memset(__s_00,0,4 - uVar8);
    uVar9 = uVar8 | 0x3c;
    __s_00 = (nk_command_buffer *)((long)__s_00 + (4 - uVar8));
  }
  uVar8 = (ulong)((uint)uVar9 & 0xfffffffc);
  memset(__s_00,0,uVar8);
  if ((uVar9 & 3) != 0) {
    memset((void *)((long)&__s_00->base + uVar8),0,uVar9 & 3);
  }
  win = ctx->begin;
  do {
    while( true ) {
      if (win == (nk_window *)0x0) {
        ctx->seq = ctx->seq + 1;
        return;
      }
      if (((win->flags & 0xc000) != 0x8000) || (win->seq != ctx->seq)) break;
LAB_0012bced:
      win = win->next;
    }
    if (((win->flags & 0x6000) != 0) && (win == ctx->active)) {
      pnVar4 = win->prev;
      ctx->active = pnVar4;
      ctx->end = pnVar4;
      if (pnVar4 == (nk_window *)0x0) {
        ctx->begin = (nk_window *)0x0;
      }
      else {
        pbVar1 = (byte *)((long)&pnVar4->flags + 1);
        *pbVar1 = *pbVar1 & 0xef;
      }
    }
    pnVar4 = (win->popup).win;
    if ((pnVar4 != (nk_window *)0x0) && (pnVar4->seq != ctx->seq)) {
      nk_free_window(ctx,pnVar4);
      (win->popup).win = (nk_window *)0x0;
    }
    pnVar5 = (nk_page_element *)win->tables;
    while (elem = pnVar5, elem != (nk_page_element *)0x0) {
      pnVar5 = (nk_page_element *)(elem->data).tbl.next;
      if ((elem->data).tbl.seq != ctx->seq) {
        if ((nk_page_element *)win->tables == elem) {
          win->tables = (nk_table *)pnVar5;
        }
        if (pnVar5 != (nk_page_element *)0x0) {
          (pnVar5->data).tbl.prev = (elem->data).tbl.prev;
        }
        pnVar6 = (elem->data).tbl.prev;
        if (pnVar6 != (nk_table *)0x0) {
          pnVar6->next = (nk_table *)pnVar5;
        }
        (elem->data).tbl.next = (nk_table *)0x0;
        (elem->data).tbl.prev = (nk_table *)0x0;
        uVar8 = (ulong)elem & 3;
        if (uVar8 == 0) {
          uVar9 = 0x1f0;
          __s = elem;
        }
        else {
          memset(elem,0,4 - uVar8);
          uVar9 = uVar8 | 0x1ec;
          __s = (nk_page_element *)((4 - uVar8) + (long)elem);
        }
        uVar8 = (ulong)((uint)uVar9 & 0xfffffffc);
        memset(__s,0,uVar8);
        if ((uVar9 & 3) != 0) {
          memset((void *)((long)&__s->data + uVar8),0,uVar9 & 3);
        }
        nk_free_page_element(ctx,elem);
        if (elem == (nk_page_element *)win->tables) {
          win->tables = (nk_table *)pnVar5;
        }
      }
    }
    if ((win->seq == ctx->seq) && ((win->flags & 0x4000) == 0)) goto LAB_0012bced;
    pnVar4 = win->next;
    nk_remove_window(ctx,win);
    nk_free_window(ctx,win);
    win = pnVar4;
  } while( true );
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure valid minimized windows do not get removed */
        if ((iter->flags & NK_WINDOW_MINIMIZED) &&
            !(iter->flags & NK_WINDOW_CLOSED) &&
            iter->seq == ctx->seq) {
            iter = iter->next;
            continue;
        }
        /* remove hotness from hidden or closed windows*/
        if (((iter->flags & NK_WINDOW_HIDDEN) ||
            (iter->flags & NK_WINDOW_CLOSED)) &&
            iter == ctx->active) {
            ctx->active = iter->prev;
            ctx->end = iter->prev;
            if (!ctx->end)
                ctx->begin = 0;
            if (ctx->active)
                ctx->active->flags &= ~(unsigned)NK_WINDOW_ROM;
        }
        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }
        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            } it = n;
        }}
        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}